

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

int SMCompatible2_Band(SUNMatrix A,N_Vector x,N_Vector y)

{
  SUNMatrix_ID SVar1;
  N_Vector_ID NVar2;
  N_Vector y_local;
  N_Vector x_local;
  SUNMatrix A_local;
  
  SVar1 = SUNMatGetID(A);
  if (SVar1 == SUNMATRIX_BAND) {
    NVar2 = N_VGetVectorID(x);
    if (((NVar2 != SUNDIALS_NVEC_SERIAL) &&
        (NVar2 = N_VGetVectorID(x), NVar2 != SUNDIALS_NVEC_OPENMP)) &&
       (NVar2 = N_VGetVectorID(x), NVar2 != SUNDIALS_NVEC_PTHREADS)) {
      return 0;
    }
    A_local._4_4_ = 1;
  }
  else {
    A_local._4_4_ = 0;
  }
  return A_local._4_4_;
}

Assistant:

static booleantype SMCompatible2_Band(SUNMatrix A, N_Vector x, N_Vector y)
{
  /*   matrix must be SUNMATRIX_BAND */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return SUNFALSE;

  /*   vectors must be one of {SERIAL, OPENMP, PTHREADS} */ 
  if ( (N_VGetVectorID(x) != SUNDIALS_NVEC_SERIAL) &&
       (N_VGetVectorID(x) != SUNDIALS_NVEC_OPENMP) &&
       (N_VGetVectorID(x) != SUNDIALS_NVEC_PTHREADS) )
    return SUNFALSE;

  /* Optimally we would verify that the dimensions of A, x and y agree, 
   but since there is no generic 'length' routine for N_Vectors we cannot */

  return SUNTRUE;
}